

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void __thiscall
LinearGE<1,_0>::LinearGE(LinearGE<1,_0> *this,vec<int> *a,vec<IntVar_*> *_x,int _c,BoolView *_r)

{
  uint uVar1;
  int *piVar2;
  undefined8 uVar3;
  ulong uVar4;
  IntView<2> local_48;
  vec<IntView<3>_> *local_38;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_48.var = (IntVar *)this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_48);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__LinearGE_0020e138;
  uVar1 = _x->sz;
  (this->pos).sz = uVar1;
  (this->pos).cap = uVar1;
  if ((ulong)uVar1 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)calloc(1,(ulong)uVar1 << 2);
  }
  (this->pos).data = piVar2;
  (this->x).sz = 0;
  (this->x).cap = 0;
  (this->x).data = (IntView<2> *)0x0;
  (this->y).sz = 0;
  (this->y).cap = 0;
  (this->y).data = (IntView<3> *)0x0;
  this->c = _c;
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020bb98;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  this->fix = 0;
  this->fix_x = 0;
  this->fix_y = 0;
  this->fix_sum = (long)-_c;
  vec<Lit>::vec(&this->ps,_x->sz);
  (this->super_Propagator).priority = 2;
  if (_x->sz != 0) {
    local_38 = &this->y;
    uVar4 = 0;
    do {
      piVar2 = a->data;
      if (piVar2[uVar4] < 1) {
        (this->pos).data[uVar4] = ~(this->y).sz;
        local_48.a = -piVar2[uVar4];
        local_48.var = _x->data[uVar4];
        local_48.b = 0;
        vec<IntView<3>_>::push(local_38,(IntView<3> *)&local_48);
        uVar3 = 2;
      }
      else {
        (this->pos).data[uVar4] = (this->x).sz;
        local_48.var = _x->data[uVar4];
        local_48.a = piVar2[uVar4];
        local_48.b = 0;
        vec<IntView<2>_>::push(&this->x,&local_48);
        uVar3 = 4;
      }
      (*(_x->data[uVar4]->super_Var).super_Branching._vptr_Branching[7])
                (_x->data[uVar4],this,uVar4 & 0xffffffff,uVar3);
      uVar4 = uVar4 + 1;
    } while (uVar4 < _x->sz);
  }
  return;
}

Assistant:

LinearGE(vec<int>& a, vec<IntVar*>& _x, int _c, BoolView _r = bv_true)
			: pos(_x.size()),
				c(_c),
				r(std::move(_r)),

				fix_sum(-c),
				ps(R + _x.size()) {
		priority = 2;

		for (unsigned int i = 0; i < _x.size(); i++) {
			assert(a[i]);
			if (a[i] > 0) {
				pos[i] = x.size();
				x.push(IntView<2 * S>(_x[i], a[i]));
				_x[i]->attach(this, i, EVENT_U);
			} else {
				pos[i] = -static_cast<int>(y.size()) - 1;
				y.push(IntView<2 * S + 1>(_x[i], -a[i]));
				_x[i]->attach(this, i, EVENT_L);
			}
		}
		if (R != 0) {
			r.attach(this, _x.size(), EVENT_L);
		}
	}